

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::TokenError(Parser *this)

{
  long *plVar1;
  long *plVar2;
  Parser *in_RSI;
  long *local_58;
  long local_48;
  long lStack_40;
  string local_38;
  
  TokenToStringId_abi_cxx11_(&local_38,in_RSI,(in_RSI->super_ParserState).token_);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x1b197d);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Error(this,(string *)in_RSI);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::TokenError() {
  return Error("cannot parse value starting with: " + TokenToStringId(token_));
}